

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O3

boolean jpeg_finish_output(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  
  iVar2 = cinfo->global_state;
  if (iVar2 - 0xcdU < 2) {
    if (cinfo->buffered_image != 0) {
      (*cinfo->master->finish_output_pass)(cinfo);
      cinfo->global_state = 0xd0;
      goto LAB_0011c039;
    }
  }
  else if (iVar2 == 0xd0) goto LAB_0011c039;
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x14;
  (pjVar1->msg_parm).i[0] = iVar2;
  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_0011c039:
  while ((cinfo->input_scan_number <= cinfo->output_scan_number &&
         (cinfo->inputctl->eoi_reached == 0))) {
    iVar2 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar2 == 0) {
      return 0;
    }
  }
  cinfo->global_state = 0xcf;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_finish_output(j_decompress_ptr cinfo)
{
  if ((cinfo->global_state == DSTATE_SCANNING ||
       cinfo->global_state == DSTATE_RAW_OK) && cinfo->buffered_image) {
    /* Terminate this pass. */
    /* We do not require the whole pass to have been completed. */
    (*cinfo->master->finish_output_pass) (cinfo);
    cinfo->global_state = DSTATE_BUFPOST;
  } else if (cinfo->global_state != DSTATE_BUFPOST) {
    /* BUFPOST = repeat call after a suspension, anything else is error */
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  /* Read markers looking for SOS or EOI */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return FALSE;             /* Suspend, come back later */
  }
  cinfo->global_state = DSTATE_BUFIMAGE;
  return TRUE;
}